

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

Anchor * AddAnchor(TidyDocImpl *doc,ctmbstr name,Node *node)

{
  int iVar1;
  Anchor *pAVar2;
  Anchor *local_40;
  Anchor *here;
  uint h;
  Anchor *a;
  TidyAttribImpl *attribs;
  Node *node_local;
  ctmbstr name_local;
  TidyDocImpl *doc_local;
  
  pAVar2 = NewAnchor(doc,name,node);
  iVar1 = prvTidyHTMLVersion(doc);
  if (iVar1 == 0x20000) {
    here._4_4_ = anchorNameHash5(name);
  }
  else {
    here._4_4_ = anchorNameHash(name);
  }
  if ((doc->attribs).anchor_hash[here._4_4_] == (Anchor *)0x0) {
    (doc->attribs).anchor_hash[here._4_4_] = pAVar2;
  }
  else {
    for (local_40 = (doc->attribs).anchor_hash[here._4_4_]; local_40->next != (_Anchor *)0x0;
        local_40 = local_40->next) {
    }
    local_40->next = pAVar2;
  }
  return (doc->attribs).anchor_hash[here._4_4_];
}

Assistant:

static Anchor* AddAnchor( TidyDocImpl* doc, ctmbstr name, Node *node )
{
    TidyAttribImpl* attribs = &doc->attribs;
    Anchor *a = NewAnchor( doc, name, node );
    uint h;
    if (TY_(HTMLVersion)(doc) == HT50)
        h = anchorNameHash5(name);
    else
        h = anchorNameHash(name);

    if ( attribs->anchor_hash[h] == NULL)
         attribs->anchor_hash[h] = a;
    else
    {
        Anchor *here =  attribs->anchor_hash[h];
        while (here->next)
            here = here->next;
        here->next = a;
    }

    return attribs->anchor_hash[h];
}